

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O1

void jsoncons::
     encode_traits<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,char,void>
     ::encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *val,basic_json_visitor<char> *encoder,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *proto,
               error_code *ec)

{
  _Base_ptr p_Var1;
  bool bVar2;
  string_view_type local_50;
  _Rb_tree_node_base *local_40;
  ser_context local_38;
  
  local_50._M_len = (size_t)&PTR__ser_context_00b58eb8;
  (*encoder->_vptr_basic_json_visitor[4])
            (encoder,(val->_M_t)._M_impl.super__Rb_tree_header._M_node_count,0,&local_50,ec);
  if (ec->_M_value == 0) {
    p_Var1 = (val->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_40 = &(val->_M_t)._M_impl.super__Rb_tree_header._M_header;
    bVar2 = p_Var1 == local_40;
    if (!bVar2) {
      do {
        local_50._M_str = *(char **)(p_Var1 + 1);
        local_50._M_len = (size_t)p_Var1[1]._M_parent;
        local_38._vptr_ser_context = (_func_int **)&PTR__ser_context_00b58eb8;
        basic_json_visitor<char>::key(encoder,&local_50,&local_38);
        local_50._M_len = (size_t)&PTR__ser_context_00b58eb8;
        (*encoder->_vptr_basic_json_visitor[0x12])
                  (*(undefined8 *)(p_Var1 + 2),encoder,0,&local_50,ec);
        if (ec->_M_value != 0) {
          if (!bVar2) {
            return;
          }
          break;
        }
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
        bVar2 = p_Var1 == local_40;
      } while (!bVar2);
    }
    local_50._M_len = (size_t)&PTR__ser_context_00b58eb8;
    (*encoder->_vptr_basic_json_visitor[5])(encoder,&local_50,ec);
  }
  return;
}

Assistant:

static void encode(const T& val, 
                           basic_json_visitor<CharT>& encoder, 
                           const Json& proto, 
                           std::error_code& ec)
        {
            encoder.begin_object(val.size(), semantic_tag::none, ser_context(), ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            for (auto it = std::begin(val); it != std::end(val); ++it)
            {
                encoder.key((*it).first);
                encode_traits<mapped_type,CharT>::encode((*it).second, encoder, proto, ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
            }
            encoder.end_object(ser_context(), ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
        }